

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLpUtils.cpp
# Opt level: O0

bool activeModifiedUpperBounds
               (HighsOptions *options,HighsLp *lp,vector<double,_std::allocator<double>_> *col_value
               )

{
  size_type sVar1;
  const_reference pvVar2;
  const_reference pvVar3;
  vector<double,_std::allocator<double>_> *this;
  double *pdVar4;
  vector<double,_std::allocator<double>_> *in_RDX;
  long in_RSI;
  long in_RDI;
  double semi_variable_margin;
  double upper;
  double value;
  HighsInt k;
  double min_semi_variable_margin;
  HighsInt num_active_modified_upper;
  HighsInt num_tightened_upper;
  vector<int,_std::allocator<int>_> *tightened_semi_variable_upper_bound_index;
  double local_50;
  double local_48;
  value_type local_40;
  int local_34;
  HighsLogOptions *local_30;
  uint local_28;
  int local_24;
  vector<int,_std::allocator<int>_> *local_20;
  long local_10;
  long local_8;
  
  local_20 = (vector<int,_std::allocator<int>_> *)(in_RSI + 0x308);
  local_10 = in_RSI;
  local_8 = in_RDI;
  sVar1 = std::vector<int,_std::allocator<int>_>::size(local_20);
  local_24 = (int)sVar1;
  local_28 = 0;
  local_30 = (HighsLogOptions *)0x7ff0000000000000;
  for (local_34 = 0; local_34 < local_24; local_34 = local_34 + 1) {
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](local_20,(long)local_34);
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](in_RDX,(long)*pvVar2);
    local_40 = *pvVar3;
    this = (vector<double,_std::allocator<double>_> *)(local_10 + 0x38);
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](local_20,(long)local_34);
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](this,(long)*pvVar2);
    local_48 = *pvVar3;
    local_50 = local_48 - local_40;
    if (local_40 <= local_48 - *(double *)(local_8 + 0x118)) {
      pdVar4 = std::min<double>(&local_50,(double *)&local_30);
      local_30 = (HighsLogOptions *)*pdVar4;
    }
    else {
      local_30 = (HighsLogOptions *)0x0;
      local_28 = local_28 + 1;
    }
  }
  if (local_28 == 0) {
    if (local_24 != 0) {
      highsLogUser(local_30,(HighsLogType)(local_8 + 0x380),(char *)0x4,
                   "No semi-variables are active at modified upper bounds: a large minimum margin (%g) suggests optimality, but there is no guarantee\n"
                  );
    }
  }
  else {
    highsLogUser((HighsLogOptions *)(local_8 + 0x380),kError,
                 "%d semi-variables are active at modified upper bounds\n",(ulong)local_28);
  }
  return local_28 != 0;
}

Assistant:

bool activeModifiedUpperBounds(const HighsOptions& options, const HighsLp& lp,
                               const std::vector<double> col_value) {
  const std::vector<HighsInt>& tightened_semi_variable_upper_bound_index =
      lp.mods_.save_tightened_semi_variable_upper_bound_index;
  const HighsInt num_tightened_upper =
      tightened_semi_variable_upper_bound_index.size();
  HighsInt num_active_modified_upper = 0;
  double min_semi_variable_margin = kHighsInf;
  for (HighsInt k = 0; k < num_tightened_upper; k++) {
    const double value =
        col_value[tightened_semi_variable_upper_bound_index[k]];
    const double upper =
        lp.col_upper_[tightened_semi_variable_upper_bound_index[k]];
    double semi_variable_margin = upper - value;
    if (value > upper - options.primal_feasibility_tolerance) {
      min_semi_variable_margin = 0;
      num_active_modified_upper++;
    } else {
      min_semi_variable_margin =
          std::min(semi_variable_margin, min_semi_variable_margin);
    }
  }
  if (num_active_modified_upper) {
    highsLogUser(options.log_options, HighsLogType::kError,
                 "%" HIGHSINT_FORMAT
                 " semi-variables are active at modified upper bounds\n",
                 num_active_modified_upper);
  } else if (num_tightened_upper) {
    highsLogUser(options.log_options, HighsLogType::kWarning,
                 "No semi-variables are active at modified upper bounds:"
                 " a large minimum margin (%g) suggests optimality,"
                 " but there is no guarantee\n",
                 min_semi_variable_margin);
  }
  return (num_active_modified_upper != 0);
}